

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O1

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::CreateBacking
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this,uint index)

{
  uint **obj;
  JitArenaAllocator *this_00;
  long lVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  uint **ppuVar6;
  ulong uVar7;
  char *pcVar8;
  uint i;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  if ((index < this->maxIndex) && (this->backingStore[index >> 4] != (uint *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ClusterList.h"
                       ,0xc4,"(index >= maxIndex || backingStore[index / numPerSegment] == nullptr)"
                       ,"index >= maxIndex || backingStore[index / numPerSegment] == nullptr");
    if (!bVar3) goto LAB_003f635f;
    *puVar5 = 0;
  }
  uVar9 = index + 1 & 0xf;
  uVar11 = (index - uVar9) + 0x11;
  if (uVar9 == 0) {
    uVar11 = index + 1;
  }
  uVar13 = uVar11 >> 4;
  uVar9 = this->maxIndex;
  uVar12 = uVar9 >> 4;
  if (uVar12 < uVar13) {
    ppuVar6 = (uint **)new__<Memory::JitArenaAllocator>((ulong)(uVar13 * 8),this->alloc,0x3f1274);
    if (0xf < uVar9) {
      uVar7 = 0;
      do {
        ppuVar6[uVar7] = this->backingStore[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar12 != uVar7);
    }
    memset(ppuVar6 + (uVar9 >> 4),0,(ulong)(uVar13 + ~uVar12) * 8 + 8);
    this->maxIndex = uVar11;
    obj = this->backingStore;
    this->backingStore = ppuVar6;
    Memory::DeleteArray<Memory::JitArenaAllocator,unsigned_int*>(this->alloc,(ulong)uVar12,obj);
  }
  if (this->backingStore[index >> 4] == (uint *)0x0) {
    this_00 = this->alloc;
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_003f635f;
      *puVar5 = 0;
    }
    pcVar8 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           this_00,0x40);
    if (pcVar8 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_003f635f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    uVar7 = (ulong)((index >> 4) << 3);
    *(char **)((long)this->backingStore + uVar7) = pcVar8;
    lVar1 = *(long *)((long)this->backingStore + uVar7);
    lVar10 = 0;
    do {
      *(uint *)(lVar1 + lVar10 * 4) = index & 0xfffffff0 | (uint)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x10);
  }
  return;
}

Assistant:

inline void CreateBacking(indexType index)
    {
        Assert(index >= maxIndex || backingStore[index / numPerSegment] == nullptr);
        // grow the size of the pointer array if needed
        EnsureBaseSize(index);
        if (backingStore[index / numPerSegment] == nullptr)
        {
            // allocate a new segment
            backingStore[index / numPerSegment] = AllocatorNewArrayLeaf(TAllocator, alloc, indexType, numPerSegment);
            indexType baseForSegment = (index / numPerSegment) * numPerSegment;
            for (indexType i = 0; i < numPerSegment; i++)
            {
                backingStore[index / numPerSegment][i] = i + baseForSegment;
            }
        }
    }